

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O0

file_mapping *
cornelich::util::create_mapping(file_mapping *__return_storage_ptr__,string *path,uint32_t size)

{
  bool bVar1;
  uintmax_t uVar2;
  ulong uVar3;
  char *filename;
  path local_90;
  path local_70;
  path local_40;
  uint32_t local_1c;
  string *psStack_18;
  uint32_t size_local;
  string *path_local;
  file_mapping *mapping;
  
  local_1c = size;
  psStack_18 = path;
  path_local = (string *)__return_storage_ptr__;
  boost::filesystem::path::path(&local_40,path);
  bVar1 = boost::filesystem::exists(&local_40);
  boost::filesystem::path::~path(&local_40);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    touch(psStack_18);
  }
  boost::filesystem::path::path(&local_70,psStack_18);
  uVar2 = boost::filesystem::file_size(&local_70);
  uVar3 = (ulong)local_1c;
  boost::filesystem::path::~path(&local_70);
  if (uVar2 < uVar3) {
    boost::filesystem::path::path(&local_90,psStack_18);
    boost::filesystem::resize_file(&local_90,(ulong)local_1c);
    boost::filesystem::path::~path(&local_90);
  }
  filename = (char *)std::__cxx11::string::c_str();
  boost::interprocess::file_mapping::file_mapping(__return_storage_ptr__,filename,read_write);
  return __return_storage_ptr__;
}

Assistant:

bip::file_mapping create_mapping(const std::string & path, std::uint32_t size)
{
    if(!fs::exists(path))
    {
        touch(path);
    }
    if(fs::file_size(path) < size)
    {
        fs::resize_file(path, size);
    }
    auto mapping = bip::file_mapping(path.c_str(), bip::read_write);
    return mapping;
}